

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

void __thiscall mpt::reference<mpt::layout::text>::type::type(type *this,uintptr_t initial)

{
  (this->super_text).super_metatype.super_convertable._vptr_convertable =
       (_func_int **)&PTR_convert_0014a8c0;
  (this->super_text).super_object._vptr_object = (_func_int **)&PTR___cxa_pure_virtual_0014b648;
  (this->super_text).super_text.color.alpha = 0xff;
  (this->super_text).super_text.color.red = '\0';
  (this->super_text).super_text.color.green = '\0';
  (this->super_text).super_text.color.blue = '\0';
  (this->super_text).super_text.pos.super_point<float> = (point<float>)0x0;
  mpt_text_init(&(this->super_text).super_text,0);
  (this->super_text).super_metatype.super_convertable._vptr_convertable =
       (_func_int **)&PTR_convert_0014ba58;
  (this->super_text).super_object._vptr_object = (_func_int **)&PTR_property_0014baa8;
  (this->_ref)._val = initial;
  return;
}

Assistant:

type(uintptr_t initial = 1) : _ref(initial)
		{ }